

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O3

int wally_is_elements_build(size_t *written)

{
  if (written != (size_t *)0x0) {
    *written = 1;
    return 0;
  }
  return -2;
}

Assistant:

int wally_is_elements_build(size_t *written)
{
    if (!written)
        return WALLY_EINVAL;
#ifdef BUILD_ELEMENTS
    *written = 1;
#else
    *written = 0;
#endif
    return WALLY_OK;
}